

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::icu_calendar_facet::icu_calendar_facet
          (icu_calendar_facet *this,cdata *d,size_t refs)

{
  *(uint *)&(this->super_calendar_facet).field_0x8 = (uint)(refs != 0);
  *(undefined ***)&this->super_calendar_facet = &PTR__icu_calendar_facet_001dae88;
  cdata::cdata(&this->data_,d);
  return;
}

Assistant:

icu_calendar_facet(cdata const &d,size_t refs = 0) : 
            calendar_facet(refs),
            data_(d)
        {
        }